

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

bool __thiscall llvm::APInt::operator[](APInt *this,uint bitPosition)

{
  APInt *pAVar1;
  
  if (bitPosition < this->BitWidth) {
    pAVar1 = (APInt *)((ulong)(bitPosition >> 3 & 0x1ffffff8) + (long)(this->U).pVal);
    if (this->BitWidth < 0x41) {
      pAVar1 = this;
    }
    return ((pAVar1->U).VAL >> ((ulong)bitPosition & 0x3f) & 1) != 0;
  }
  __assert_fail("bitPosition < getBitWidth() && \"Bit position out of bounds!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x457,"bool llvm::APInt::operator[](unsigned int) const");
}

Assistant:

unsigned getBitWidth() const { return BitWidth; }